

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-internal-utils.cc
# Opt level: O0

void testing::internal::Log(LogSeverity severity,string *message,int stack_frames_to_skip)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  const_reference pvVar4;
  reference pcVar5;
  ostream *poVar6;
  UnitTest local_60 [32];
  undefined1 local_40 [16];
  int actual_to_skip;
  GTestMutexLock local_28;
  MutexLock l;
  int stack_frames_to_skip_local;
  string *message_local;
  LogSeverity severity_local;
  
  l.mutex_._4_4_ = stack_frames_to_skip;
  bVar1 = LogIsVisible(severity);
  if (bVar1) {
    GTestMutexLock::GTestMutexLock(&local_28,(MutexBase *)g_log_mutex);
    if (severity == kWarning) {
      std::operator<<((ostream *)&std::cout,"\nGMOCK WARNING:");
    }
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      (message);
    if ((bVar1) ||
       (pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[](message,0), *pvVar4 != '\n')) {
      std::operator<<((ostream *)&std::cout,"\n");
    }
    std::operator<<((ostream *)&std::cout,(string *)message);
    if (-1 < l.mutex_._4_4_) {
      local_40._8_4_ = l.mutex_._4_4_ + 1;
      bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        (message);
      bVar1 = false;
      if (!bVar2) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rbegin
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
        pcVar5 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_40);
        bVar1 = *pcVar5 != '\n';
      }
      if (bVar1) {
        std::operator<<((ostream *)&std::cout,"\n");
      }
      poVar6 = std::operator<<((ostream *)&std::cout,"Stack trace:\n");
      iVar3 = testing::UnitTest::GetInstance();
      testing::internal::GetCurrentOsStackTraceExceptTop_abi_cxx11_(local_60,iVar3);
      std::operator<<(poVar6,(string *)local_60);
      std::__cxx11::string::~string((string *)local_60);
    }
    std::ostream::operator<<(&std::cout,std::flush<char,std::char_traits<char>>);
    GTestMutexLock::~GTestMutexLock(&local_28);
  }
  return;
}

Assistant:

GTEST_API_ void Log(LogSeverity severity, const std::string& message,
                    int stack_frames_to_skip) {
  if (!LogIsVisible(severity))
    return;

  // Ensures that logs from different threads don't interleave.
  MutexLock l(&g_log_mutex);

  if (severity == kWarning) {
    // Prints a GMOCK WARNING marker to make the warnings easily searchable.
    std::cout << "\nGMOCK WARNING:";
  }
  // Pre-pends a new-line to message if it doesn't start with one.
  if (message.empty() || message[0] != '\n') {
    std::cout << "\n";
  }
  std::cout << message;
  if (stack_frames_to_skip >= 0) {
#ifdef NDEBUG
    // In opt mode, we have to be conservative and skip no stack frame.
    const int actual_to_skip = 0;
#else
    // In dbg mode, we can do what the caller tell us to do (plus one
    // for skipping this function's stack frame).
    const int actual_to_skip = stack_frames_to_skip + 1;
#endif  // NDEBUG

    // Appends a new-line to message if it doesn't end with one.
    if (!message.empty() && *message.rbegin() != '\n') {
      std::cout << "\n";
    }
    std::cout << "Stack trace:\n"
         << ::testing::internal::GetCurrentOsStackTraceExceptTop(
             ::testing::UnitTest::GetInstance(), actual_to_skip);
  }
  std::cout << ::std::flush;
}